

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O2

ze_result_t
tracing_layer::zeImageGetMemoryPropertiesExp
          (ze_image_handle_t hImage,ze_image_memory_properties_exp_t *pMemoryProperties)

{
  ulong uVar1;
  _func__ze_result_t__ze_image_handle_t_ptr__ze_image_memory_properties_exp_t_ptr *zeApiPtr;
  _ze_result_t _Var2;
  ze_result_t zVar3;
  char *pcVar4;
  undefined1 *puVar5;
  ulong *puVar6;
  _func_void__ze_image_get_memory_properties_exp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
  *p_Var7;
  long lVar8;
  _ze_image_memory_properties_exp_t *in_RSI;
  _ze_image_handle_t *in_RDI;
  size_t i;
  ulong uVar9;
  APITracerCallbackDataImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  ze_image_get_memory_properties_exp_params_t tracerParams;
  ze_image_memory_properties_exp_t *local_d8;
  ze_image_handle_t local_d0;
  APITracerCallbackDataImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
  local_c8;
  value_type local_90;
  value_type local_80;
  _ze_image_get_memory_properties_exp_params_t local_70;
  _Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_60;
  _Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_48;
  
  if (DAT_001894f0 ==
      (_func__ze_result_t__ze_image_handle_t_ptr__ze_image_memory_properties_exp_t_ptr *)0x0) {
    zVar3 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    pcVar4 = (char *)tracingInProgress();
    if (*pcVar4 != '\0') {
      _Var2 = (*DAT_001894f0)(in_RDI,in_RSI);
      return _Var2;
    }
    puVar5 = (undefined1 *)tracingInProgress();
    *puVar5 = 1;
    local_70.phImage = &local_d0;
    local_70.ppMemoryProperties = &local_d8;
    local_c8.epilogCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.epilogCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.prologCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.prologCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8.epilogCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8.apiOrdinal =
         (_func_void__ze_image_get_memory_properties_exp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
          *)0x0;
    local_c8.prologCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    puVar6 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
    if (puVar6 == (ulong *)0x0) {
      p_Var7 = (_func_void__ze_image_get_memory_properties_exp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                *)0x0;
    }
    else {
      lVar8 = 0xcb0;
      for (uVar9 = 0; p_Var7 = local_c8.apiOrdinal, uVar9 < *puVar6; uVar9 = uVar9 + 1) {
        uVar1 = puVar6[1];
        local_80.current_api_callback =
             *(_func_void__ze_image_get_memory_properties_exp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
               **)((uVar1 - 0x860) + lVar8);
        p_Var7 = *(_func_void__ze_image_get_memory_properties_exp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                   **)((uVar1 - 0x208) + lVar8);
        local_80.pUserData = *(void **)(uVar1 + lVar8);
        std::
        vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ::push_back(&local_c8.prologCallbacks,&local_80);
        local_90.pUserData = *(void **)(puVar6[1] + lVar8);
        local_90.current_api_callback = p_Var7;
        std::
        vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ::push_back(&local_c8.epilogCallbacks,&local_90);
        lVar8 = lVar8 + 0xcb8;
      }
    }
    zeApiPtr = DAT_001894f0;
    std::
    vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::vector((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
              *)&local_48,&local_c8.prologCallbacks);
    std::
    vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::vector((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
              *)&local_60,&local_c8.epilogCallbacks);
    zVar3 = APITracerWrapperImp<_ze_result_t(*)(_ze_image_handle_t*,_ze_image_memory_properties_exp_t*),_ze_image_get_memory_properties_exp_params_t*,void(*)(_ze_image_get_memory_properties_exp_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_image_get_memory_properties_exp_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_image_get_memory_properties_exp_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_image_get_memory_properties_exp_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_image_get_memory_properties_exp_params_t*,_ze_result_t,void*,void**)>>>,_ze_image_handle_t*&,_ze_image_memory_properties_exp_t*&>
                      (zeApiPtr,&local_70,p_Var7,
                       (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                        *)&local_48,
                       (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                        *)&local_60,&local_d0,&local_d8);
    std::
    _Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::~_Vector_base(&local_60);
    std::
    _Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::~_Vector_base(&local_48);
    APITracerCallbackDataImp<void_(*)(_ze_image_get_memory_properties_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
    ::~APITracerCallbackDataImp(&local_c8);
  }
  return zVar3;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeImageGetMemoryPropertiesExp(
        ze_image_handle_t hImage,                       ///< [in] handle of image object
        ze_image_memory_properties_exp_t* pMemoryProperties ///< [in,out] query result for image memory properties.
        )
    {
        auto pfnGetMemoryPropertiesExp = context.zeDdiTable.ImageExp.pfnGetMemoryPropertiesExp;

        if( nullptr == pfnGetMemoryPropertiesExp)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.ImageExp.pfnGetMemoryPropertiesExp, hImage, pMemoryProperties);

        // capture parameters
        ze_image_get_memory_properties_exp_params_t tracerParams = {
            &hImage,
            &pMemoryProperties
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnImageGetMemoryPropertiesExpCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnImageGetMemoryPropertiesExpCb_t, Image, pfnGetMemoryPropertiesExpCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.ImageExp.pfnGetMemoryPropertiesExp,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.phImage,
                                                  *tracerParams.ppMemoryProperties);
    }